

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
               (CodedInputStream *input,RepeatedField<unsigned_int> *values)

{
  bool bVar1;
  int in_EAX;
  Limit limit;
  int iVar2;
  int length;
  uint value;
  int local_28;
  uint32 local_24;
  
  local_28 = in_EAX;
  bVar1 = io::CodedInputStream::ReadVarintSizeAsInt(input,&local_28);
  if (bVar1) {
    limit = io::CodedInputStream::PushLimit(input,local_28);
    while( true ) {
      iVar2 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar2 < 1) break;
      bVar1 = io::CodedInputStream::ReadVarint32(input,&local_24);
      if (!bVar1) goto LAB_004bd83b;
      RepeatedField<unsigned_int>::Add(values,&local_24);
    }
    io::CodedInputStream::PopLimit(input,limit);
    bVar1 = true;
  }
  else {
LAB_004bd83b:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}